

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

int float128_is_quiet_nan_m68k(float128 a,float_status *status)

{
  return (int)((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
               a.low != 0) && 0xfffe < (a.high._4_4_ >> 0xf & 0xffff));
}

Assistant:

int float128_is_quiet_nan(float128 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return float128_is_any_nan(a);
#else
    if (snan_bit_is_one(status)) {
        return (((a.high >> 47) & 0xFFFF) == 0xFFFE)
            && (a.low || (a.high & 0x00007FFFFFFFFFFFULL));
    } else {
        return ((a.high << 1) >= 0xFFFF000000000000ULL)
            && (a.low || (a.high & 0x0000FFFFFFFFFFFFULL));
    }
#endif
}